

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  istream *this;
  ostream *poVar1;
  mapped_type *pmVar2;
  long lVar3;
  int in_ECX;
  int i;
  int iVar4;
  undefined1 local_70 [8];
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> mountains;
  int SX;
  int SY;
  int MH;
  
  SY = 0;
  do {
    this = (istream *)
           std::istream::operator>>
                     ((istream *)&std::cin,
                      (int *)&mountains._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::istream::operator>>
              (this,(int *)((long)&mountains._M_t._M_impl.super__Rb_tree_header._M_node_count + 4));
    std::istream::ignore();
    mountains._M_t._M_impl._0_4_ = 0;
    mountains._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    mountains._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    mountains._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&mountains;
    mountains._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    mountains._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         mountains._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    for (iVar4 = 0; iVar4 != 8; iVar4 = iVar4 + 1) {
      std::istream::operator>>((istream *)&std::cin,&SX);
      std::istream::ignore();
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar4);
      poVar1 = std::operator<<(poVar1,": ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,SX);
      std::endl<char,std::char_traits<char>>(poVar1);
      pmVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)local_70,&SX);
      *pmVar2 = iVar4;
    }
    if (((byte)SY & mountains._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ == 0x18894) ==
        0) {
      if ((_Base_ptr)&mountains != mountains._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
      {
        poVar1 = std::operator<<((ostream *)&std::cerr,"Highest mountain is ");
        lVar3 = std::_Rb_tree_decrement((_Rb_tree_node_base *)&mountains);
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(lVar3 + 0x24));
        std::endl<char,std::char_traits<char>>(poVar1);
        if ((_Base_ptr)&mountains !=
            mountains._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
          lVar3 = std::_Rb_tree_decrement((_Rb_tree_node_base *)&mountains);
          if (*(int *)(lVar3 + 0x24) ==
              (int)mountains._M_t._M_impl.super__Rb_tree_header._M_node_count) {
            poVar1 = std::operator<<((ostream *)&std::cout,"FIRE");
            in_ECX = CONCAT31((int3)((uint)in_ECX >> 8),1);
            SY = in_ECX;
            std::endl<char,std::char_traits<char>>(poVar1);
            goto LAB_0010243f;
          }
        }
      }
      poVar1 = std::operator<<((ostream *)&std::cout,"HOLD");
      std::endl<char,std::char_traits<char>>(poVar1);
      SY = 0;
    }
    else {
      poVar1 = std::operator<<((ostream *)&std::cout,"HOLD");
      in_ECX = CONCAT31((int3)((uint)in_ECX >> 8),1);
      SY = in_ECX;
      std::endl<char,std::char_traits<char>>(poVar1);
    }
LAB_0010243f:
    std::
    _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                 *)local_70);
  } while( true );
}

Assistant:

int main()
{
    int last_sy = 100500;
    // game loop
    bool discharged = false;
    while (1)
    {
        int SX;
        int SY;
        cin >> SX >> SY;
        cin.ignore();

        typedef std::map<int, int> mountains_t;
        std::map<int, int> mountains;
        for (int i = 0; i < 8; i++)
        {
            int MH; // represents the height of one mountain, from 9 to 0. Mountain heights are provided from left to right.
            cin >> MH;
            cin.ignore();
            
            std::cerr << i << ": " << MH << std::endl;
            mountains[MH] = i;
        }
        
        if (last_sy != SY)
        {
            discharged = false;
        }

        if (!discharged)
        {
            mountains_t::const_reverse_iterator m = mountains.rbegin();
            if (m != mountains.rend())
            {
                std::cerr << "Highest mountain is " << m->second << std::endl;
            }
            if (m != mountains.rend() && m->second == SX)
            {
                std::cout << "FIRE" << std::endl;
                discharged = true;
            } else
            {
                std::cout << "HOLD" << std::endl;
            }
        } else
        {
            std::cout << "HOLD" << std::endl;
        }
    }
}